

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_support_format_7zip(archive *_a)

{
  int iVar1;
  void *format_data;
  int magic_test;
  int r;
  _7zip_conflict *zip;
  archive_read *a;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_7zip");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    format_data = calloc(1,0x50c0);
    if (format_data == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate 7zip data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *(undefined4 *)((long)format_data + 0x50b8) = 0xffffffff;
      iVar1 = __archive_read_register_format
                        ((archive_read *)_a,format_data,"7zip",archive_read_format_7zip_bid,
                         (_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                         archive_read_format_7zip_read_header,archive_read_format_7zip_read_data,
                         archive_read_format_7zip_read_data_skip,
                         (_func_int64_t_archive_read_ptr_int64_t_int *)0x0,
                         archive_read_format_7zip_cleanup,
                         archive_read_support_format_7zip_capabilities,
                         archive_read_format_7zip_has_encrypted_entries);
      if (iVar1 != 0) {
        free(format_data);
      }
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_format_7zip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct _7zip *zip;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_7zip");

	zip = calloc(1, sizeof(*zip));
	if (zip == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate 7zip data");
		return (ARCHIVE_FATAL);
	}

	/*
	 * Until enough data has been read, we cannot tell about
	 * any encrypted entries yet.
	 */
	zip->has_encrypted_entries = ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;


	r = __archive_read_register_format(a,
	    zip,
	    "7zip",
	    archive_read_format_7zip_bid,
	    NULL,
	    archive_read_format_7zip_read_header,
	    archive_read_format_7zip_read_data,
	    archive_read_format_7zip_read_data_skip,
	    NULL,
	    archive_read_format_7zip_cleanup,
	    archive_read_support_format_7zip_capabilities,
	    archive_read_format_7zip_has_encrypted_entries);

	if (r != ARCHIVE_OK)
		free(zip);
	return (ARCHIVE_OK);
}